

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyProfiler.cpp
# Opt level: O0

void __thiscall tracy::Profiler::SendCallstackPayload(Profiler *this,uint64_t _ptr)

{
  ulong uVar1;
  size_t __n;
  undefined2 local_d2;
  ulong uStack_d0;
  uint16_t l16;
  unsigned_long len;
  uintptr_t sz;
  QueueItem item;
  uintptr_t *ptr;
  uint64_t _ptr_local;
  Profiler *this_local;
  bool ret;
  
  sz._0_1_ = 0x62;
  item.field_1._23_8_ = _ptr + 8;
  len = *(unsigned_long *)_ptr;
  uStack_d0 = len << 3;
  local_d2 = (undefined2)uStack_d0;
  uVar1 = (uStack_d0 & 0xffff) + 0xb;
  unique0x1000012f = _ptr;
  if (0x40000 < uVar1) {
    __assert_fail("len <= TargetFrameSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/client/TracyProfiler.hpp"
                  ,0x2db,"bool tracy::Profiler::NeedDataSize(size_t)");
  }
  if (0x40000 < (this->m_bufferOffset - this->m_bufferStart) + (int)uVar1) {
    CommitData(this);
  }
  memcpy(this->m_buffer + this->m_bufferOffset,&sz,9);
  this->m_bufferOffset = this->m_bufferOffset + 9;
  memcpy(this->m_buffer + this->m_bufferOffset,&local_d2,2);
  this->m_bufferOffset = this->m_bufferOffset + 2;
  __n = len << 3;
  memcpy(this->m_buffer + this->m_bufferOffset,(void *)item.field_1._23_8_,__n);
  this->m_bufferOffset = (int)__n + this->m_bufferOffset;
  return;
}

Assistant:

void Profiler::SendCallstackPayload( uint64_t _ptr )
{
    auto ptr = (uintptr_t*)_ptr;

    QueueItem item;
    MemWrite( &item.hdr.type, QueueType::CallstackPayload );
    MemWrite( &item.stringTransfer.ptr, _ptr );

    const auto sz = *ptr++;
    const auto len = sz * sizeof( uint64_t );
    const auto l16 = uint16_t( len );

    NeedDataSize( QueueDataSize[(int)QueueType::CallstackPayload] + sizeof( l16 ) + l16 );

    AppendDataUnsafe( &item, QueueDataSize[(int)QueueType::CallstackPayload] );
    AppendDataUnsafe( &l16, sizeof( l16 ) );

    if( compile_time_condition<sizeof( uintptr_t ) == sizeof( uint64_t )>::value )
    {
        AppendDataUnsafe( ptr, sizeof( uint64_t ) * sz );
    }
    else
    {
        for( uintptr_t i=0; i<sz; i++ )
        {
            const auto val = uint64_t( *ptr++ );
            AppendDataUnsafe( &val, sizeof( uint64_t ) );
        }
    }
}